

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimEvalRemapping
              (Sfm_Tim_t *p,Vec_Int_t *vFanins,Vec_Int_t *vMap,Mio_Gate_t *pGate1,char *pFans1,
              Mio_Gate_t *pGate2,char *pFans2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int nFanins2;
  int nFanins1;
  int i;
  int *pTimesIn2 [6];
  int *pTimesIn1 [6];
  int TimeOut [2] [2];
  Mio_Gate_t *pGate2_local;
  char *pFans1_local;
  Mio_Gate_t *pGate1_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFanins_local;
  Sfm_Tim_t *p_local;
  
  iVar1 = Mio_GateReadPinNum(pGate1);
  for (nFanins2 = 0; nFanins2 < iVar1; nFanins2 = nFanins2 + 1) {
    iVar2 = Vec_IntEntry(vFanins,(int)pFans1[nFanins2]);
    iVar2 = Vec_IntEntry(vMap,iVar2);
    piVar3 = Sfm_TimArrId(p,iVar2);
    pTimesIn2[(long)nFanins2 + 5] = piVar3;
  }
  Sfm_TimGateArrival(p,pGate1,pTimesIn2 + 5,(int *)(pTimesIn1 + 5));
  if (pGate2 == (Mio_Gate_t *)0x0) {
    p_local._4_4_ = Abc_MaxInt((int)pTimesIn1[5],pTimesIn1[5]._4_4_);
  }
  else {
    iVar1 = Mio_GateReadPinNum(pGate2);
    for (nFanins2 = 0; nFanins2 < iVar1; nFanins2 = nFanins2 + 1) {
      if (pFans2[nFanins2] == '\x10') {
        *(int ***)(&nFanins1 + (long)nFanins2 * 2) = pTimesIn1 + 5;
      }
      else {
        iVar2 = Vec_IntEntry(vFanins,(int)pFans2[nFanins2]);
        iVar2 = Vec_IntEntry(vMap,iVar2);
        piVar3 = Sfm_TimArrId(p,iVar2);
        *(int **)(&nFanins1 + (long)nFanins2 * 2) = piVar3;
      }
    }
    Sfm_TimGateArrival(p,pGate2,(int **)&nFanins1,TimeOut[0]);
    p_local._4_4_ = Abc_MaxInt(TimeOut[0][0],TimeOut[0][1]);
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_TimEvalRemapping( Sfm_Tim_t * p, Vec_Int_t * vFanins, Vec_Int_t * vMap, Mio_Gate_t * pGate1, char * pFans1, Mio_Gate_t * pGate2, char * pFans2 )
{
    int TimeOut[2][2];
    int * pTimesIn1[6], * pTimesIn2[6];
    int i, nFanins1, nFanins2;
    // process the first gate
    nFanins1 = Mio_GateReadPinNum( pGate1 );
    for ( i = 0; i < nFanins1; i++ )
        pTimesIn1[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans1[i])) );
    Sfm_TimGateArrival( p, pGate1, pTimesIn1, TimeOut[0] );
    if ( pGate2 == NULL )
        return Abc_MaxInt(TimeOut[0][0], TimeOut[0][1]);
    // process the second gate
    nFanins2 = Mio_GateReadPinNum( pGate2 );
    for ( i = 0; i < nFanins2; i++ )
        if ( (int)pFans2[i] == 16 )
            pTimesIn2[i] = TimeOut[0];
        else
            pTimesIn2[i] = Sfm_TimArrId( p, Vec_IntEntry(vMap, Vec_IntEntry(vFanins, (int)pFans2[i])) );
    Sfm_TimGateArrival( p, pGate2, pTimesIn2, TimeOut[1] );
    return Abc_MaxInt(TimeOut[1][0], TimeOut[1][1]);
}